

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O0

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B,int n,int k)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> C_01;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> T_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> T_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> B_01;
  bool bVar1;
  reference puVar2;
  uint *puVar3;
  difference_type dVar4;
  reference piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  int *in_RCX;
  undefined8 in_RDX;
  uint *in_RDI;
  int in_R8D;
  char_type c1;
  char_type c0;
  int j;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  uint in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  int *local_60;
  undefined8 local_58;
  undefined8 local_50;
  uint *local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_24;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  undefined8 local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_8;
  
  local_24 = in_R8D;
  local_20._M_current = in_RCX;
  local_18 = in_RDX;
  local_8._M_current = in_RDI;
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_30);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar1) {
    local_48 = local_8._M_current;
    local_50 = local_18;
    T_00._M_current._4_4_ = in_stack_ffffffffffffff44;
    T_00._M_current._0_4_ = in_stack_ffffffffffffff40;
    C_00._M_current._4_4_ = in_stack_ffffffffffffff3c;
    C_00._M_current._0_4_ = in_stack_ffffffffffffff38;
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (T_00,C_00,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  }
  local_58 = local_18;
  local_60 = local_20._M_current;
  B_00._M_current._4_4_ = in_stack_ffffffffffffff4c;
  B_00._M_current._0_4_ = in_stack_ffffffffffffff48;
  getBuckets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_ffffffffffffff50,B_00,in_stack_ffffffffffffff44,
             SUB41((uint)in_stack_ffffffffffffff40 >> 0x18,0));
  local_38 = local_24 - 1;
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator[](&local_8,(long)(int)local_38);
  local_40 = *puVar2;
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator[]
            (&local_20,(ulong)local_40);
  local_68 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  uVar6 = local_38;
  local_30 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_68;
  if ((0 < (int)local_38) &&
     (puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[](&local_8,(long)(int)(local_38 - 1)), uVar6 = local_38,
     *puVar2 < local_40)) {
    uVar6 = local_38 ^ 0xffffffff;
  }
  uVar7 = uVar6;
  local_70 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        in_stack_ffffffffffffff34);
  puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_70);
  *puVar3 = uVar6;
  for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[](&local_10,(long)local_34);
    local_38 = *puVar3;
    in_stack_ffffffffffffff44 = local_38 ^ 0xffffffff;
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[](&local_10,(long)local_34);
    *puVar3 = in_stack_ffffffffffffff44;
    if (0 < (int)local_38) {
      local_38 = local_38 - 1;
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[](&local_8,(long)(int)local_38);
      local_3c = *puVar2;
      if (local_3c != local_40) {
        dVar4 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff40 = (int)dVar4;
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator[](&local_20,(ulong)local_40);
        *piVar5 = in_stack_ffffffffffffff40;
        local_40 = local_3c;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator[]
                  (&local_20,(ulong)local_3c);
        local_78 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                                    ,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        local_30 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_78;
      }
      in_stack_ffffffffffffff38 = local_38;
      if ((0 < (int)local_38) &&
         (puVar2 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[](&local_8,(long)(int)(local_38 - 1)),
         in_stack_ffffffffffffff38 = local_38, *puVar2 < local_40)) {
        in_stack_ffffffffffffff38 = local_38 ^ 0xffffffff;
      }
      in_stack_ffffffffffffff3c = in_stack_ffffffffffffff38;
      local_80 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff38,in_stack_ffffffffffffff38),
                            in_stack_ffffffffffffff34);
      puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_80);
      *puVar3 = in_stack_ffffffffffffff38;
    }
  }
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar1) {
    T_01._M_current._4_4_ = in_stack_ffffffffffffff44;
    T_01._M_current._0_4_ = in_stack_ffffffffffffff40;
    C_01._M_current._4_4_ = in_stack_ffffffffffffff3c;
    C_01._M_current._0_4_ = in_stack_ffffffffffffff38;
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (T_01,C_01,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  }
  B_01._M_current._4_4_ = uVar7;
  B_01._M_current._0_4_ = uVar6;
  getBuckets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_ffffffffffffff50,B_01,in_stack_ffffffffffffff44,
             SUB41((uint)in_stack_ffffffffffffff40 >> 0x18,0));
  local_34 = local_24 + -1;
  local_40 = 0;
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator[]
            (&local_20,0);
  local_30 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  for (; -1 < local_34; local_34 = local_34 + -1) {
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[](&local_10,(long)local_34);
    local_38 = *puVar3;
    if ((int)local_38 < 1) {
      in_stack_ffffffffffffff28 = local_38 ^ 0xffffffff;
      puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator[](&local_10,(long)local_34);
      *puVar3 = in_stack_ffffffffffffff28;
    }
    else {
      local_38 = local_38 - 1;
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator[](&local_8,(long)(int)local_38);
      local_3c = *puVar2;
      if (local_3c != local_40) {
        dVar4 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff34 = (int)dVar4;
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator[](&local_20,(ulong)local_40);
        *piVar5 = in_stack_ffffffffffffff34;
        local_40 = local_3c;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator[]
                  (&local_20,(ulong)local_3c);
        local_30 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      if ((local_38 == 0) ||
         (puVar2 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator[](&local_8,(long)(int)(local_38 - 1)),
         in_stack_ffffffffffffff2c = local_38, local_40 < *puVar2)) {
        in_stack_ffffffffffffff2c = local_38 ^ 0xffffffff;
      }
      in_stack_ffffffffffffff30 = in_stack_ffffffffffffff2c;
      this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator--(&local_30);
      puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(this);
      *puVar3 = in_stack_ffffffffffffff2c;
    }
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}